

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.c
# Opt level: O2

void al_unlock_index_buffer(ALLEGRO_INDEX_BUFFER *buffer)

{
  undefined8 uVar1;
  byte bVar2;
  
  uVar1 = al_get_current_display();
  bVar2 = al_get_display_flags(uVar1);
  if ((buffer->common).is_locked == true) {
    (buffer->common).is_locked = false;
    if ((bVar2 & 4) != 0) {
      _al_unlock_index_buffer_opengl(buffer);
      return;
    }
    if ((bVar2 & 8) != 0) {
      _al_unlock_index_buffer_directx(buffer);
      return;
    }
  }
  return;
}

Assistant:

void al_unlock_index_buffer(ALLEGRO_INDEX_BUFFER* buffer)
{
	int flags = al_get_display_flags(al_get_current_display());
   ASSERT(buffer);
   ASSERT(addon_initialized);

   if (!buffer->common.is_locked)
      return;

   buffer->common.is_locked = false;

   if (flags & ALLEGRO_OPENGL) {
      _al_unlock_index_buffer_opengl(buffer);
   }
   else if (flags & ALLEGRO_DIRECT3D) {
      _al_unlock_index_buffer_directx(buffer);
   }
}